

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tarray.h
# Opt level: O1

uint __thiscall
TArray<FIWADInfo,_FIWADInfo>::Reserve(TArray<FIWADInfo,_FIWADInfo> *this,uint amount)

{
  undefined8 *puVar1;
  uint uVar2;
  FIWADInfo *pFVar3;
  long lVar4;
  ulong uVar5;
  
  Grow(this,amount);
  uVar2 = this->Count;
  uVar5 = (ulong)uVar2;
  this->Count = amount + uVar2;
  if (uVar2 < amount + uVar2) {
    lVar4 = uVar5 * 0x60;
    do {
      pFVar3 = this->Array;
      *(undefined8 *)((long)&(pFVar3->Name).Chars + lVar4) = 0x87e02c;
      *(undefined8 *)((long)&(pFVar3->Autoname).Chars + lVar4) = 0x87e02c;
      *(undefined8 *)((long)&(pFVar3->Configname).Chars + lVar4) = 0x87e02c;
      *(undefined8 *)((long)&(pFVar3->Required).Chars + lVar4) = 0x87e02c;
      *(undefined8 *)((long)&(pFVar3->MapInfo).Chars + lVar4) = 0x87e02c;
      FString::NullString.RefCount = FString::NullString.RefCount + 5;
      puVar1 = (undefined8 *)((long)&(pFVar3->Lumps).Array + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      puVar1 = (undefined8 *)((long)&(pFVar3->Load).Array + lVar4);
      *puVar1 = 0;
      puVar1[1] = 0;
      *(undefined8 *)((long)&pFVar3->flags + lVar4) = 0xffffffff00000000;
      *(undefined8 *)((long)&pFVar3->FgColor + lVar4) = 0xc0c0c000000000;
      *(undefined4 *)((long)&pFVar3->gametype + lVar4) = 1;
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x60;
    } while (uVar5 < this->Count);
  }
  return uVar2;
}

Assistant:

unsigned int Reserve (unsigned int amount)
	{
		Grow (amount);
		unsigned int place = Count;
		Count += amount;
		for (unsigned int i = place; i < Count; ++i)
		{
			::new((void *)&Array[i]) T;
		}
		return place;
	}